

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathGeneratorAdapterTests::PathIteratorRewoundOnStart(PathGeneratorAdapterTests *this)

{
  allocator local_e9;
  string local_e8 [32];
  LocationInfo local_c8;
  path local_a0;
  real_t local_80 [2];
  real_t dummy;
  undefined1 local_70 [8];
  mock_path_sink s;
  path p;
  point input [3];
  PathGeneratorAdapterTests *this_local;
  
  p.position = 0x4150000041200000;
  tests::mocks::path::path<agge::tests::mocks::path::point,3ul>
            ((path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(point (*) [3])&p.position)
  ;
  mock_path_sink::mock_path_sink((mock_path_sink *)local_70);
  tests::mocks::path::vertex
            ((path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_80,local_80);
  tests::mocks::path::vertex
            ((path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_80,local_80);
  tests::mocks::path::path
            (&local_a0,
             (path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  add_path<agge::tests::PathGeneratorAdapterTests::mock_path_sink,agge::tests::mocks::path>
            ((mock_path_sink *)local_70,&local_a0);
  tests::mocks::path::~path(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_c8,(string *)local_e8,0x174);
  ut::
  are_equal<agge::tests::mocks::path::point,3ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [3])&p.position,
             (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)local_70,&local_c8);
  ut::LocationInfo::~LocationInfo(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  mock_path_sink::~mock_path_sink((mock_path_sink *)local_70);
  tests::mocks::path::~path
            ((path *)&s.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

test( PathIteratorRewoundOnStart )
			{
				// INIT
				mocks::path::point input[] = {
					{ 10.0f, 13.0f, path_command_move_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 3.0f, 7.0f, path_command_line_to },
				};
				mocks::path p(input);
				mock_path_sink s;
				real_t dummy;

				p.vertex(&dummy, &dummy);
				p.vertex(&dummy, &dummy);

				// ACT
				add_path(s, p);

				// ASSERT
				assert_equal(input, s.points);
			}